

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9250::IMUInit(RTIMUMPU9250 *this)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RAX;
  RTIMUSettings *pRVar3;
  undefined4 extraout_var;
  byte bVar4;
  uchar result;
  uchar local_11;
  
  local_11 = (uchar)((ulong)in_RAX >> 0x38);
  this->m_firstTime = true;
  this->m_cacheCount = 0;
  this->m_cacheIn = 0;
  this->m_cacheOut = 0;
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  pRVar3 = (this->super_RTIMU).m_settings;
  this->m_slaveAddr = pRVar3->m_I2CSlaveAddress;
  setSampleRate(this,pRVar3->m_MPU9250GyroAccelSampleRate);
  pRVar3 = (this->super_RTIMU).m_settings;
  if (pRVar3->m_MPU9250CompassSampleRate - 1U < 100) {
    this->m_compassRate = pRVar3->m_MPU9250CompassSampleRate;
  }
  else {
    fprintf(_stderr,"Illegal compass rate %d\n");
    pRVar3 = (this->super_RTIMU).m_settings;
  }
  bVar4 = (byte)pRVar3->m_MPU9250GyroLpf;
  if ((bVar4 < 7) || ((pRVar3->m_MPU9250GyroLpf & 0xffU) - 0x10 < 2)) {
    this->m_gyroLpf = bVar4;
  }
  else {
    fprintf(_stderr,"Illegal MPU9250 gyro lpf %d\n");
    pRVar3 = (this->super_RTIMU).m_settings;
  }
  bVar4 = (byte)pRVar3->m_MPU9250AccelLpf;
  if ((bVar4 < 7) || ((pRVar3->m_MPU9250AccelLpf & 0xffU) == 8)) {
    this->m_accelLpf = bVar4;
  }
  else {
    fprintf(_stderr,"Illegal MPU9250 accel lpf %d\n");
    pRVar3 = (this->super_RTIMU).m_settings;
  }
  setGyroFsr(this,(uchar)pRVar3->m_MPU9250GyroFsr);
  setAccelFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9250AccelFsr);
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar1 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if ((bVar1) &&
     (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr
                                 ,'k',0x80,"Failed to initiate MPU9250 reset"), bVar1)) {
    RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,100);
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               'k','\0',"Failed to stop MPU9250 reset");
    if (!bVar1) {
      return false;
    }
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              'u','\x01',&local_11,"Failed to read MPU9250 id");
    if (bVar1) {
      if (local_11 == 'q') {
        bVar1 = setGyroConfig(this);
        if ((((bVar1) && (bVar1 = setAccelConfig(this), bVar1)) &&
            (bVar1 = setSampleRate(this), bVar1)) &&
           (((bVar1 = compassSetup(this), bVar1 && (bVar1 = setCompassRate(this), bVar1)) &&
            (bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                        this->m_slaveAddr,'k','\x01',"Failed to set pwr_mgmt_1"),
            bVar1)))) {
          bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                     this->m_slaveAddr,'l','\0',"Failed to set pwr_mgmt_2");
          if (!bVar1) {
            return false;
          }
          bVar1 = resetFifo(this);
          if (bVar1) {
            RTIMU::gyroBiasInit(&this->super_RTIMU);
            iVar2 = (*(this->super_RTIMU)._vptr_RTIMU[2])(this);
            printf("%s init complete\n",CONCAT44(extraout_var,iVar2));
            fflush(_stdout);
            return true;
          }
        }
      }
      else {
        IMUInit();
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUMPU9250::IMUInit()
{
    unsigned char result;

    m_firstTime = true;

#ifdef MPU9250_CACHE_MODE
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif

    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_slaveAddr = m_settings->m_I2CSlaveAddress;

    setSampleRate(m_settings->m_MPU9250GyroAccelSampleRate);
    setCompassRate(m_settings->m_MPU9250CompassSampleRate);
    setGyroLpf(m_settings->m_MPU9250GyroLpf);
    setAccelLpf(m_settings->m_MPU9250AccelLpf);
    setGyroFsr(m_settings->m_MPU9250GyroFsr);
    setAccelFsr(m_settings->m_MPU9250AccelFsr);

    setCalibrationData();


    //  enable the bus

    if (!m_settings->HALOpen())
        return false;

    //  reset the MPU9250

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 0x80, "Failed to initiate MPU9250 reset"))
        return false;

    m_settings->delayMs(100);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 0x00, "Failed to stop MPU9250 reset"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9250_WHO_AM_I, 1, &result, "Failed to read MPU9250 id"))
        return false;

    if (result != MPU9250_ID) {
        HAL_ERROR2("Incorrect %s id %d\n", IMUName(), result);
        return false;
    }

    //  now configure the various components

    if (!setGyroConfig())
        return false;

    if (!setAccelConfig())
        return false;

    if (!setSampleRate())
        return false;

    if(!compassSetup()) {
        return false;
    }

    if (!setCompassRate())
        return false;

    //  enable the sensors

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_1, 1, "Failed to set pwr_mgmt_1"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_PWR_MGMT_2, 0, "Failed to set pwr_mgmt_2"))
         return false;

    //  select the data to go into the FIFO and enable

    if (!resetFifo())
        return false;

    gyroBiasInit();

    HAL_INFO1("%s init complete\n", IMUName());
    return true;
}